

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_half(secp256k1_fe *r)

{
  secp256k1_modinv64_modinfo *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_ge *psVar5;
  secp256k1_ge *psVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  secp256k1_ge *psVar12;
  long lVar13;
  long lVar14;
  secp256k1_ge *psVar15;
  ulong uVar16;
  secp256k1_ge *psVar17;
  secp256k1_ge *psVar18;
  secp256k1_ge *a;
  secp256k1_ge *a_00;
  long lVar19;
  uint64_t *puVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  secp256k1_ge *psVar24;
  secp256k1_ge *a_01;
  bool bVar25;
  undefined1 auVar26 [16];
  secp256k1_strauss_state sStack_b38;
  secp256k1_gej sStack_b20;
  secp256k1_fe asStack_a88 [8];
  secp256k1_ge asStack_908 [8];
  secp256k1_strauss_point_state sStack_5c8;
  secp256k1_ge *psStack_1b8;
  secp256k1_ge *psStack_1b0;
  code *pcStack_1a8;
  secp256k1_ge *psStack_198;
  secp256k1_ge *psStack_190;
  secp256k1_modinv64_modinfo *psStack_188;
  ulong uStack_180;
  secp256k1_ge *psStack_178;
  secp256k1_ge *psStack_170;
  ulong uStack_168;
  secp256k1_ge *psStack_160;
  secp256k1_ge *psStack_158;
  undefined1 auStack_150 [96];
  ulong uStack_f0;
  secp256k1_ge *psStack_e8;
  undefined1 auStack_e0 [56];
  ulong uStack_a8;
  ulong uStack_a0;
  secp256k1_ge *psStack_98;
  secp256k1_modinv64_signed62 sStack_90;
  secp256k1_modinv64_signed62 sStack_60;
  secp256k1_fe *psStack_38;
  
  secp256k1_fe_verify(r);
  a_00 = (secp256k1_ge *)r;
  secp256k1_fe_verify_magnitude(r,0x1f);
  psStack_188 = (secp256k1_modinv64_modinfo *)r->n[0];
  uVar3 = -(ulong)((uint)psStack_188 & 1);
  uVar9 = uVar3 >> 0xc;
  uVar8 = (long)(psStack_188->modulus).v + (uVar9 & 0xffffefffffc2f);
  if ((uVar8 & 1) == 0) {
    uVar4 = (uVar3 >> 0x10) + r->n[4];
    uVar10 = uVar9 + r->n[3];
    uVar22 = (uint)(uVar3 >> 0x2c);
    auVar26._0_8_ = CONCAT44(uVar22,(int)uVar9);
    auVar26._8_4_ = (int)uVar9;
    auVar26._12_4_ = uVar22;
    uVar3 = auVar26._0_8_ + r->n[1];
    uVar9 = auVar26._8_8_ + r->n[2];
    r->n[0] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar8 >> 1);
    r->n[1] = ((uVar9 & 1) << 0x33) + (uVar3 >> 1);
    r->n[2] = ((uVar10 & 1) << 0x33) + (uVar9 >> 1);
    r->n[3] = ((ulong)((uint)uVar4 & 1) << 0x33) + (uVar10 >> 1);
    r->n[4] = uVar4 >> 1;
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_half_cold_1();
  uVar3 = 0;
  sStack_90.v[2] = 0;
  sStack_90.v[3] = 0;
  sStack_90.v[0] = 0;
  sStack_90.v[1] = 0;
  sStack_90.v[4] = 0;
  sStack_60.v[1] = 0;
  sStack_60.v[4] = 0;
  sStack_60.v[2] = 0;
  sStack_60.v[3] = 0;
  sStack_60.v[0] = 1;
  auStack_150._32_8_ = (psStack_188->modulus).v[4];
  auStack_150._0_8_ = (psStack_188->modulus).v[0];
  psStack_160 = (secp256k1_ge *)(psStack_188->modulus).v[1];
  uStack_168 = (psStack_188->modulus).v[2];
  psStack_190 = (secp256k1_ge *)(psStack_188->modulus).v[3];
  auStack_e0._0_8_ = (a_00->x).n[0];
  psStack_170 = (secp256k1_ge *)(a_00->x).n[1];
  psStack_178 = (secp256k1_ge *)(a_00->x).n[2];
  psStack_158 = (secp256k1_ge *)(a_00->x).n[3];
  a_01 = (secp256k1_ge *)(a_00->x).n[4];
  uVar9 = 0xffffffffffffffff;
  psVar15 = (secp256k1_ge *)auStack_150._0_8_;
  psVar18 = (secp256k1_ge *)auStack_e0._0_8_;
  psVar6 = (secp256k1_ge *)auStack_150._32_8_;
  auStack_150._8_8_ = psStack_160;
  auStack_150._16_8_ = uStack_168;
  auStack_150._24_8_ = psStack_190;
  auStack_150._48_8_ = a_00;
  auStack_e0._8_8_ = psStack_170;
  auStack_e0._16_8_ = psStack_178;
  auStack_e0._24_8_ = psStack_158;
  auStack_e0._32_8_ = a_01;
  psStack_38 = r;
  do {
    psVar1 = psStack_188;
    uVar4 = 8;
    lVar11 = 3;
    uVar8 = 0;
    uVar10 = 0;
    psVar17 = (secp256k1_ge *)0x8;
    psStack_198 = (secp256k1_ge *)0x8;
    psVar5 = psVar18;
    psVar12 = psVar15;
    psVar24 = a_01;
    do {
      auStack_150._72_8_ = uVar3;
      auStack_150._80_8_ = a_01;
      auStack_150._88_8_ = psVar6;
      if (((ulong)psVar12 & 1) == 0) {
        pcStack_1a8 = (code *)0x14e590;
        secp256k1_modinv64_cold_29();
        a = a_00;
LAB_0014e590:
        pcStack_1a8 = (code *)0x14e595;
        secp256k1_modinv64_cold_1();
LAB_0014e595:
        pcStack_1a8 = (code *)0x14e59a;
        secp256k1_modinv64_cold_2();
LAB_0014e59a:
        pcStack_1a8 = (code *)0x14e59f;
        secp256k1_modinv64_cold_28();
        goto LAB_0014e59f;
      }
      a = (secp256k1_ge *)(uVar8 * (long)psVar18 + uVar4 * (long)psVar15);
      psVar17 = (secp256k1_ge *)((long)psVar12 << ((byte)lVar11 & 0x3f));
      if (a != psVar17) goto LAB_0014e590;
      a = (secp256k1_ge *)((long)psStack_198 * (long)psVar18 + uVar10 * (long)psVar15);
      psVar17 = (secp256k1_ge *)((long)psVar5 << ((byte)lVar11 & 0x3f));
      if (a != psVar17) goto LAB_0014e595;
      psVar17 = (secp256k1_ge *)((long)uVar9 >> 0x3f);
      uStack_f0 = (ulong)((uint)psVar5 & 1);
      uVar7 = -uStack_f0;
      a_00 = (secp256k1_ge *)((ulong)psVar17 & uVar7);
      uVar9 = uVar9 ^ (ulong)a_00;
      r = &psVar15->x;
      a = a_00;
      psVar24 = psVar18;
      psStack_e8 = psVar17;
      if (uVar9 - 0x251 < 0xfffffffffffffb61) goto LAB_0014e59a;
      uVar9 = uVar9 - 1;
      a = (secp256k1_ge *)
          ((long)(psStack_198->x).n + (((ulong)psVar17 ^ uVar8) - (long)psVar17 & uVar7));
      uVar8 = (uVar8 + ((ulong)a & (ulong)a_00)) * 2;
      uVar10 = uVar10 + (((ulong)psVar17 ^ uVar4) - (long)psVar17 & uVar7);
      uVar4 = (uVar4 + (uVar10 & (ulong)a_00)) * 2;
      uVar7 = (long)(psVar5->x).n + (((ulong)psVar17 ^ (ulong)psVar12) - (long)psVar17 & uVar7);
      psVar5 = (secp256k1_ge *)(uVar7 >> 1);
      psVar12 = (secp256k1_ge *)((long)(psVar12->x).n + (uVar7 & (ulong)a_00));
      lVar11 = lVar11 + 1;
      psStack_198 = a;
    } while (lVar11 != 0x3e);
    psVar17 = (secp256k1_ge *)(uVar8 * uVar10);
    auStack_e0._48_8_ = uVar4;
    uStack_a8 = uVar8;
    uStack_a0 = uVar10;
    psStack_98 = a;
    if ((SUB168(SEXT816((long)uVar4) * SEXT816((long)a),8) -
        SUB168(SEXT816((long)uVar8) * SEXT816((long)uVar10),8)) -
        (ulong)((secp256k1_ge *)(uVar4 * (long)a) < psVar17) != 2 ||
        (long)(uVar4 * (long)a) - (long)psVar17 != 0) {
LAB_0014e59f:
      pcStack_1a8 = (code *)0x14e5a4;
      secp256k1_modinv64_cold_3();
LAB_0014e5a4:
      pcStack_1a8 = (code *)0x14e5a9;
      secp256k1_modinv64_cold_27();
LAB_0014e5a9:
      pcStack_1a8 = (code *)0x14e5ae;
      secp256k1_modinv64_cold_26();
LAB_0014e5ae:
      psVar6 = a;
      pcStack_1a8 = (code *)0x14e5b3;
      secp256k1_modinv64_cold_25();
LAB_0014e5b3:
      pcStack_1a8 = (code *)0x14e5b8;
      secp256k1_modinv64_cold_24();
LAB_0014e5b8:
      pcStack_1a8 = (code *)0x14e5bd;
      secp256k1_modinv64_cold_4();
LAB_0014e5bd:
      pcStack_1a8 = (code *)0x14e5c2;
      secp256k1_modinv64_cold_5();
LAB_0014e5c2:
      pcStack_1a8 = (code *)0x14e5c7;
      secp256k1_modinv64_cold_6();
LAB_0014e5c7:
      pcStack_1a8 = (code *)0x14e5cc;
      secp256k1_modinv64_cold_7();
LAB_0014e5cc:
      pcStack_1a8 = (code *)0x14e5d1;
      secp256k1_modinv64_cold_8();
LAB_0014e5d1:
      pcStack_1a8 = (code *)0x14e5d6;
      secp256k1_modinv64_cold_9();
LAB_0014e5d6:
      pcStack_1a8 = (code *)0x14e5db;
      secp256k1_modinv64_cold_10();
      psVar15 = (secp256k1_ge *)r;
LAB_0014e5db:
      pcStack_1a8 = (code *)0x14e5e0;
      secp256k1_modinv64_cold_11();
LAB_0014e5e0:
      pcStack_1a8 = (code *)0x14e5e5;
      secp256k1_modinv64_cold_12();
      a_01 = psVar24;
LAB_0014e5e5:
      pcStack_1a8 = (code *)0x14e5ea;
      secp256k1_modinv64_cold_13();
LAB_0014e5ea:
      pcStack_1a8 = (code *)0x14e5ef;
      secp256k1_modinv64_cold_14();
LAB_0014e5ef:
      pcStack_1a8 = (code *)0x14e5f4;
      secp256k1_modinv64_cold_15();
LAB_0014e5f4:
      pcStack_1a8 = (code *)0x14e5f9;
      secp256k1_modinv64_cold_23();
      psVar18 = psVar17;
LAB_0014e5f9:
      pcStack_1a8 = (code *)0x14e5fe;
      secp256k1_modinv64_cold_22();
LAB_0014e5fe:
      a_00 = psVar6;
      pcStack_1a8 = (code *)0x14e603;
      secp256k1_modinv64_cold_21();
      r = &psVar15->x;
LAB_0014e603:
      pcStack_1a8 = (code *)0x14e608;
      secp256k1_modinv64_cold_20();
LAB_0014e608:
      pcStack_1a8 = (code *)0x14e60d;
      secp256k1_modinv64_cold_19();
LAB_0014e60d:
      pcStack_1a8 = (code *)0x14e612;
      secp256k1_modinv64_cold_18();
      goto LAB_0014e612;
    }
    pcStack_1a8 = (code *)0x14dd3b;
    uStack_180 = uVar10;
    secp256k1_modinv64_update_de_62
              (&sStack_90,&sStack_60,(secp256k1_modinv64_trans2x2 *)(auStack_e0 + 0x30),psStack_188)
    ;
    a = (secp256k1_ge *)auStack_150;
    psVar17 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14dd54;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&psVar1->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e5a4;
    a = (secp256k1_ge *)auStack_150;
    psVar17 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14dd75;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a,5,&psStack_188->modulus,1);
    if (0 < iVar2) goto LAB_0014e5a9;
    psVar6 = (secp256k1_ge *)auStack_e0;
    psVar17 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14dd9e;
    a = psVar6;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar6,5,&psStack_188->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e5ae;
    psVar17 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14ddbd;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar6,5,&psStack_188->modulus,1);
    psVar1 = psStack_188;
    if (-1 < iVar2) goto LAB_0014e5b3;
    psVar6 = (secp256k1_ge *)(uVar4 * (long)psVar15);
    psVar17 = SUB168(SEXT816((long)uVar4) * SEXT816((long)psVar15),8);
    uVar3 = uVar8 * (long)psVar18;
    lVar11 = SUB168(SEXT816((long)uVar8) * SEXT816((long)psVar18),8);
    if ((-1 < lVar11) &&
       (uVar10 = (ulong)((secp256k1_ge *)(-1 - uVar3) < psVar6),
       lVar13 = (0x7fffffffffffffff - lVar11) - (long)psVar17,
       (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar17) != SBORROW8(lVar13,uVar10)) !=
       (long)(lVar13 - uVar10) < 0)) goto LAB_0014e5b8;
    puVar20 = (uint64_t *)((long)(psVar6->x).n + uVar3);
    lVar11 = (long)(psVar17->x).n + (ulong)CARRY8(uVar3,(ulong)psVar6) + lVar11;
    psVar6 = (secp256k1_ge *)(uStack_180 * (long)psVar15);
    psVar17 = SUB168(SEXT816((long)uStack_180) * SEXT816((long)psVar15),8);
    uVar3 = (long)psStack_198 * (long)psVar18;
    lVar13 = SUB168(SEXT816((long)psStack_198) * SEXT816((long)psVar18),8);
    if ((-1 < lVar13) &&
       (uVar10 = (ulong)((secp256k1_ge *)(-1 - uVar3) < psVar6),
       lVar14 = (0x7fffffffffffffff - lVar13) - (long)psVar17,
       (SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar17) != SBORROW8(lVar14,uVar10)) !=
       (long)(lVar14 - uVar10) < 0)) goto LAB_0014e5bd;
    bVar25 = CARRY8((ulong)psVar6,uVar3);
    psVar6 = (secp256k1_ge *)((long)(psVar6->x).n + uVar3);
    psVar17 = (secp256k1_ge *)((long)(psVar17->x).n + (ulong)bVar25 + lVar13);
    if (((ulong)puVar20 & 0x3ffffffffffffffe) != 0) goto LAB_0014e5c2;
    if (((ulong)psVar6 & 0x3fffffffffffffff) != 0) goto LAB_0014e5c7;
    uVar3 = (ulong)puVar20 >> 0x3e | lVar11 * 4;
    uVar10 = (long)psStack_160 * uVar4 + uVar3;
    lVar19 = SUB168(SEXT816((long)psStack_160) * SEXT816((long)uVar4),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8((long)psStack_160 * uVar4,uVar3);
    r = (secp256k1_fe *)((long)psStack_170 * uVar8);
    lVar14 = SUB168(SEXT816((long)psStack_170) * SEXT816((long)uVar8),8);
    uVar3 = (ulong)(-(long)r - 1U < uVar10);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar19;
    lVar21 = (-0x8000000000000000 - lVar14) - (ulong)((secp256k1_ge *)r != (secp256k1_ge *)0x0);
    lVar13 = lVar19 - lVar21;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar19) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if (lVar14 < 0) {
      bVar25 = (SBORROW8(lVar19,lVar21) != SBORROW8(lVar13,(ulong)(uVar10 < (ulong)-(long)r))) ==
               (long)(lVar13 - (ulong)(uVar10 < (ulong)-(long)r)) < 0;
    }
    psVar24 = psStack_170;
    if (!bVar25) goto LAB_0014e5cc;
    uVar3 = (ulong)psVar6 >> 0x3e | (long)psVar17 * 4;
    uVar16 = (long)psStack_160 * uStack_180 + uVar3;
    lVar13 = SUB168(SEXT816((long)psStack_160) * SEXT816((long)uStack_180),8) +
             ((long)psVar17 >> 0x3e) + (ulong)CARRY8((long)psStack_160 * uStack_180,uVar3);
    uVar7 = (long)psStack_170 * (long)psStack_198;
    psVar6 = SUB168(SEXT816((long)psStack_170) * SEXT816((long)psStack_198),8);
    uVar3 = (ulong)(-uVar7 - 1 < uVar16);
    lVar11 = (0x7fffffffffffffff - (long)psVar6) - lVar13;
    psVar17 = (secp256k1_ge *)((-0x8000000000000000 - (long)psVar6) - (ulong)(uVar7 != 0));
    bVar25 = (SBORROW8(0x7fffffffffffffff - (long)psVar6,lVar13) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if ((long)psVar6 < 0) {
      bVar25 = (SBORROW8(lVar13,(long)psVar17) !=
               SBORROW8(lVar13 - (long)psVar17,(ulong)(uVar16 < -uVar7))) ==
               (long)((lVar13 - (long)psVar17) - (ulong)(uVar16 < -uVar7)) < 0;
    }
    if (!bVar25) goto LAB_0014e5d1;
    uVar3 = (long)(((secp256k1_ge *)r)->x).n + uVar10;
    lVar11 = lVar14 + lVar19 + (ulong)CARRY8((ulong)r,uVar10);
    psVar6 = (secp256k1_ge *)((long)(psVar6->x).n + (ulong)CARRY8(uVar7,uVar16) + lVar13);
    uVar10 = lVar11 * 4 | uVar3 >> 0x3e;
    auStack_150._0_8_ = uVar3 & 0x3fffffffffffffff;
    r = (secp256k1_fe *)(uVar7 + uVar16 & 0x3fffffffffffffff);
    psStack_160 = (secp256k1_ge *)(uStack_168 * uVar4 + uVar10);
    lVar13 = (lVar11 >> 0x3e) + SUB168(SEXT816((long)uStack_168) * SEXT816((long)uVar4),8) +
             (ulong)CARRY8(uStack_168 * uVar4,uVar10);
    psStack_170 = (secp256k1_ge *)((long)psStack_178 * uVar8);
    lVar14 = SUB168(SEXT816((long)psStack_178) * SEXT816((long)uVar8),8);
    uVar3 = (ulong)((secp256k1_ge *)(-1 - (long)psStack_170) < psStack_160);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar13;
    psVar17 = (secp256k1_ge *)
              ((-0x8000000000000000 - lVar14) - (ulong)(psStack_170 != (secp256k1_ge *)0x0));
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if (lVar14 < 0) {
      bVar25 = (SBORROW8(lVar13,(long)psVar17) !=
               SBORROW8(lVar13 - (long)psVar17,
                        (ulong)(psStack_160 < (secp256k1_ge *)-(long)psStack_170))) ==
               (long)((lVar13 - (long)psVar17) -
                     (ulong)(psStack_160 < (secp256k1_ge *)-(long)psStack_170)) < 0;
    }
    psVar24 = psStack_178;
    auStack_150._64_8_ = r;
    auStack_e0._0_8_ = r;
    if (!bVar25) goto LAB_0014e5d6;
    uVar3 = uVar7 + uVar16 >> 0x3e | (long)psVar6 * 4;
    uVar7 = uStack_168 * uStack_180 + uVar3;
    psVar17 = (secp256k1_ge *)
              (SUB168(SEXT816((long)uStack_168) * SEXT816((long)uStack_180),8) +
               ((long)psVar6 >> 0x3e) + (ulong)CARRY8(uStack_168 * uStack_180,uVar3));
    uVar10 = (long)psStack_178 * (long)psStack_198;
    lVar21 = SUB168(SEXT816((long)psStack_178) * SEXT816((long)psStack_198),8);
    uVar3 = (ulong)(-uVar10 - 1 < uVar7);
    lVar11 = (0x7fffffffffffffff - lVar21) - (long)psVar17;
    lVar23 = (-0x8000000000000000 - lVar21) - (ulong)(uVar10 != 0);
    lVar19 = (long)psVar17 - lVar23;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar17) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if (lVar21 < 0) {
      bVar25 = (SBORROW8((long)psVar17,lVar23) != SBORROW8(lVar19,(ulong)(uVar7 < -uVar10))) ==
               (long)(lVar19 - (ulong)(uVar7 < -uVar10)) < 0;
    }
    psVar6 = (secp256k1_ge *)(ulong)bVar25;
    psVar15 = (secp256k1_ge *)r;
    auStack_150._56_8_ = auStack_150._0_8_;
    if (bVar25 == false) goto LAB_0014e5db;
    uVar16 = (long)(psStack_160->x).n + (long)(psStack_170->x).n;
    lVar11 = lVar13 + lVar14 + (ulong)CARRY8((ulong)psStack_160,(ulong)psStack_170);
    psVar17 = (secp256k1_ge *)((long)(psVar17->x).n + (ulong)CARRY8(uVar7,uVar10) + lVar21);
    uVar3 = lVar11 * 4 | uVar16 >> 0x3e;
    psVar24 = (secp256k1_ge *)(uVar16 & 0x3fffffffffffffff);
    psStack_170 = (secp256k1_ge *)(uVar7 + uVar10 & 0x3fffffffffffffff);
    uVar16 = (long)psStack_190 * uVar4 + uVar3;
    lVar13 = (lVar11 >> 0x3e) + SUB168(SEXT816((long)psStack_190) * SEXT816((long)uVar4),8) +
             (ulong)CARRY8((long)psStack_190 * uVar4,uVar3);
    psStack_178 = (secp256k1_ge *)((long)psStack_158 * uVar8);
    lVar14 = SUB168(SEXT816((long)psStack_158) * SEXT816((long)uVar8),8);
    uVar3 = (ulong)(-(long)psStack_178 - 1U < uVar16);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar13;
    psVar6 = (secp256k1_ge *)
             ((-0x8000000000000000 - lVar14) - (ulong)(psStack_178 != (secp256k1_ge *)0x0));
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if (lVar14 < 0) {
      bVar25 = (SBORROW8(lVar13,(long)psVar6) !=
               SBORROW8(lVar13 - (long)psVar6,(ulong)(uVar16 < (ulong)-(long)psStack_178))) ==
               (long)((lVar13 - (long)psVar6) - (ulong)(uVar16 < (ulong)-(long)psStack_178)) < 0;
    }
    psVar15 = psStack_158;
    auStack_150._8_8_ = psVar24;
    auStack_e0._8_8_ = psStack_170;
    if (!bVar25) goto LAB_0014e5e0;
    uVar3 = uVar7 + uVar10 >> 0x3e | (long)psVar17 * 4;
    uVar7 = (long)psStack_190 * uStack_180 + uVar3;
    psVar6 = (secp256k1_ge *)
             (SUB168(SEXT816((long)psStack_190) * SEXT816((long)uStack_180),8) +
              ((long)psVar17 >> 0x3e) + (ulong)CARRY8((long)psStack_190 * uStack_180,uVar3));
    uVar10 = (long)psStack_158 * (long)psStack_198;
    lVar21 = SUB168(SEXT816((long)psStack_158) * SEXT816((long)psStack_198),8);
    uVar3 = (ulong)(-uVar10 - 1 < uVar7);
    lVar11 = (0x7fffffffffffffff - lVar21) - (long)psVar6;
    lVar23 = (-0x8000000000000000 - lVar21) - (ulong)(uVar10 != 0);
    lVar19 = (long)psVar6 - lVar23;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar6) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if (lVar21 < 0) {
      bVar25 = (SBORROW8((long)psVar6,lVar23) != SBORROW8(lVar19,(ulong)(uVar7 < -uVar10))) ==
               (long)(lVar19 - (ulong)(uVar7 < -uVar10)) < 0;
    }
    psVar17 = (secp256k1_ge *)(ulong)bVar25;
    a_01 = psVar24;
    uStack_168 = uVar16;
    if (bVar25 == false) goto LAB_0014e5e5;
    uStack_168 = (long)(psStack_178->x).n + uVar16;
    lVar11 = lVar13 + lVar14 + (ulong)CARRY8(uVar16,(ulong)psStack_178);
    psVar6 = (secp256k1_ge *)((long)(psVar6->x).n + (ulong)CARRY8(uVar7,uVar10) + lVar21);
    uVar3 = lVar11 * 4 | uStack_168 >> 0x3e;
    uStack_168 = uStack_168 & 0x3fffffffffffffff;
    psStack_178 = (secp256k1_ge *)(uVar7 + uVar10 & 0x3fffffffffffffff);
    psStack_190 = (secp256k1_ge *)(auStack_150._88_8_ * uVar4 + uVar3);
    lVar14 = (lVar11 >> 0x3e) + SUB168(SEXT816((long)auStack_150._88_8_) * SEXT816((long)uVar4),8) +
             (ulong)CARRY8(auStack_150._88_8_ * uVar4,uVar3);
    uVar4 = auStack_150._80_8_ * uVar8;
    psVar17 = SUB168(SEXT816((long)auStack_150._80_8_) * SEXT816((long)uVar8),8);
    uVar3 = (ulong)((secp256k1_ge *)(-1 - uVar4) < psStack_190);
    lVar11 = (0x7fffffffffffffff - (long)psVar17) - lVar14;
    lVar19 = (-0x8000000000000000 - (long)psVar17) - (ulong)(uVar4 != 0);
    lVar13 = lVar14 - lVar19;
    bVar25 = (SBORROW8(0x7fffffffffffffff - (long)psVar17,lVar14) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if ((long)psVar17 < 0) {
      bVar25 = (SBORROW8(lVar14,lVar19) !=
               SBORROW8(lVar13,(ulong)(psStack_190 < (secp256k1_ge *)-uVar4))) ==
               (long)(lVar13 - (ulong)(psStack_190 < (secp256k1_ge *)-uVar4)) < 0;
    }
    psVar15 = (secp256k1_ge *)auStack_150._80_8_;
    a_01 = psStack_178;
    psStack_160 = psVar24;
    auStack_150._16_8_ = uStack_168;
    auStack_e0._16_8_ = psStack_178;
    if (!bVar25) goto LAB_0014e5ea;
    uVar3 = uVar7 + uVar10 >> 0x3e | (long)psVar6 * 4;
    a_01 = (secp256k1_ge *)(auStack_150._88_8_ * uStack_180 + uVar3);
    lVar21 = SUB168(SEXT816((long)auStack_150._88_8_) * SEXT816((long)uStack_180),8) +
             ((long)psVar6 >> 0x3e) + (ulong)CARRY8(auStack_150._88_8_ * uStack_180,uVar3);
    uVar8 = auStack_150._80_8_ * (long)psStack_198;
    lVar19 = SUB168(SEXT816((long)auStack_150._80_8_) * SEXT816((long)psStack_198),8);
    uVar3 = (ulong)((secp256k1_ge *)(-1 - uVar8) < a_01);
    lVar11 = (0x7fffffffffffffff - lVar19) - lVar21;
    lVar23 = (-0x8000000000000000 - lVar19) - (ulong)(uVar8 != 0);
    lVar13 = lVar21 - lVar23;
    bVar25 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar21) != SBORROW8(lVar11,uVar3)) ==
             (long)(lVar11 - uVar3) < 0;
    if (lVar19 < 0) {
      bVar25 = (SBORROW8(lVar21,lVar23) != SBORROW8(lVar13,(ulong)(a_01 < (secp256k1_ge *)-uVar8)))
               == (long)(lVar13 - (ulong)(a_01 < (secp256k1_ge *)-uVar8)) < 0;
    }
    psVar6 = (secp256k1_ge *)(ulong)bVar25;
    if (bVar25 == false) goto LAB_0014e5ef;
    puVar20 = (uint64_t *)((long)(psStack_190->x).n + uVar4);
    lVar11 = (long)(psVar17->x).n + (ulong)CARRY8((ulong)psStack_190,uVar4) + lVar14;
    bVar25 = CARRY8((ulong)a_01,uVar8);
    a_01 = (secp256k1_ge *)((long)(a_01->x).n + uVar8);
    lVar13 = lVar21 + lVar19 + (ulong)bVar25;
    psVar17 = (secp256k1_ge *)(lVar11 * 4 | (ulong)puVar20 >> 0x3e);
    psVar6 = (secp256k1_ge *)((ulong)puVar20 & 0x3fffffffffffffff);
    psVar15 = (secp256k1_ge *)((ulong)a_01 & 0x3fffffffffffffff);
    auStack_150._24_8_ = psVar6;
    auStack_e0._24_8_ = psVar15;
    if ((lVar11 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < psVar17) != -1)
    goto LAB_0014e5f4;
    a_01 = (secp256k1_ge *)((ulong)a_01 >> 0x3e | lVar13 * 4);
    psVar18 = psVar17;
    auStack_150._32_8_ = psVar17;
    if ((lVar13 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < a_01) != -1)
    goto LAB_0014e5f9;
    a_00 = (secp256k1_ge *)auStack_150;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14e3eb;
    psVar5 = a_00;
    psStack_190 = psVar6;
    auStack_e0._32_8_ = a_01;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_188->modulus,-1);
    psVar6 = psVar5;
    if (iVar2 < 1) goto LAB_0014e5fe;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14e408;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,&psVar1->modulus,1);
    r = (secp256k1_fe *)psVar15;
    if (0 < iVar2) goto LAB_0014e603;
    r = (secp256k1_fe *)auStack_e0;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14e434;
    a_00 = (secp256k1_ge *)r;
    psStack_158 = psVar15;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,&psVar1->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e608;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1a8 = (code *)0x14e451;
    a_00 = (secp256k1_ge *)r;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,&psVar1->modulus,1);
    if (-1 < iVar2) goto LAB_0014e60d;
    uVar22 = (int)auStack_150._72_8_ + 1;
    uVar3 = (ulong)uVar22;
    psVar15 = (secp256k1_ge *)auStack_150._56_8_;
    psVar18 = (secp256k1_ge *)auStack_150._64_8_;
    psVar6 = psVar17;
  } while (uVar22 != 10);
  a_00 = (secp256k1_ge *)auStack_e0;
  psVar18 = (secp256k1_ge *)0x5;
  pcStack_1a8 = (code *)0x14e499;
  iVar2 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    pcStack_1a8 = (code *)0x14e4be;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_150,5,&SECP256K1_SIGNED62_ONE,-1);
    a_01 = (secp256k1_ge *)auStack_150._48_8_;
    if (iVar2 != 0) {
      pcStack_1a8 = (code *)0x14e4e5;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_150,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar2 != 0) {
        psVar18 = (secp256k1_ge *)0x5;
        pcStack_1a8 = (code *)0x14e4ff;
        a_00 = a_01;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar2 == 0) {
          a_00 = (secp256k1_ge *)&sStack_90;
          psVar18 = (secp256k1_ge *)0x5;
          pcStack_1a8 = (code *)0x14e522;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar2 == 0) {
            a_00 = (secp256k1_ge *)auStack_150;
            psVar18 = (secp256k1_ge *)0x5;
            pcStack_1a8 = (code *)0x14e541;
            iVar2 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)a_00,5,&psVar1->modulus,1);
            if (iVar2 == 0) goto LAB_0014e549;
          }
        }
        goto LAB_0014e617;
      }
    }
LAB_0014e549:
    pcStack_1a8 = (code *)0x14e561;
    secp256k1_modinv64_normalize_62(&sStack_90,auStack_150._32_8_,psVar1);
    (a_01->x).n[4] = sStack_90.v[4];
    (a_01->x).n[2] = sStack_90.v[2];
    (a_01->x).n[3] = sStack_90.v[3];
    (a_01->x).n[0] = sStack_90.v[0];
    (a_01->x).n[1] = sStack_90.v[1];
    return;
  }
LAB_0014e612:
  pcStack_1a8 = (code *)0x14e617;
  secp256k1_modinv64_cold_16();
LAB_0014e617:
  pcStack_1a8 = secp256k1_eckey_pubkey_tweak_add;
  secp256k1_modinv64_cold_17();
  psStack_1b8 = (secp256k1_ge *)r;
  psStack_1b0 = a_01;
  pcStack_1a8 = (code *)uVar9;
  secp256k1_gej_set_ge(&sStack_b20,a_00);
  sStack_b38.aux = asStack_a88;
  sStack_b38.pre_a = asStack_908;
  sStack_b38.ps = &sStack_5c8;
  secp256k1_ecmult_strauss_wnaf
            (&sStack_b38,&sStack_b20,1,&sStack_b20,&secp256k1_scalar_one,(secp256k1_scalar *)psVar18
            );
  secp256k1_gej_verify(&sStack_b20);
  if (sStack_b20.infinity == 0) {
    secp256k1_ge_set_gej(a_00,&sStack_b20);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}